

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::operator=
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<int,_false,_std::allocator<unsigned_long>_> *in)

{
  Geometry<std::allocator<unsigned_long>_> *this_00;
  geometry_type *this_01;
  undefined8 uVar1;
  bool bVar2;
  int *piVar3;
  size_t sVar4;
  size_t *psVar5;
  reference piVar6;
  reference piVar7;
  size_t j;
  ulong uVar8;
  size_t j_1;
  Marray<int,_std::allocator<unsigned_long>_> m;
  undefined1 auStack_78 [72];
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  if ((View<int,_false,_std::allocator<unsigned_long>_> *)this != in) {
    if (in->data_ == (pointer)0x0) {
      operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
      *(undefined8 *)this = 0;
      marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
                ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&in->geometry_);
    }
    else {
      bVar2 = View<int,false,std::allocator<unsigned_long>>::
              overlaps<int,false,std::allocator<unsigned_long>>
                        ((View<int,false,std::allocator<unsigned_long>> *)this,in);
      if (bVar2) {
        Marray<int,false,std::allocator<unsigned_long>>
                  ((Marray<int,std::allocator<unsigned_long>> *)auStack_78,in);
        Marray<int,_std::allocator<unsigned_long>_>::operator=
                  ((Marray<int,_std::allocator<unsigned_long>_> *)this,
                   (Marray<int,_std::allocator<unsigned_long>_> *)auStack_78);
        Marray<int,_std::allocator<unsigned_long>_>::~Marray
                  ((Marray<int,_std::allocator<unsigned_long>_> *)auStack_78);
      }
      else {
        if (*(size_t *)(this + 0x30) != (in->geometry_).size_) {
          operator_delete(*(void **)this,*(size_t *)(this + 0x30) << 2);
          piVar3 = __gnu_cxx::new_allocator<int>::allocate
                             ((new_allocator<int> *)(this + 0x40),(in->geometry_).size_,(void *)0x0)
          ;
          *(int **)this = piVar3;
        }
        this_00 = (Geometry<std::allocator<unsigned_long>_> *)(this + 8);
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(this_00,sVar4);
        this_01 = &in->geometry_;
        uVar8 = 0;
        while( true ) {
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
          if (sVar4 <= uVar8) break;
          sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_01,uVar8);
          psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,uVar8);
          *psVar5 = sVar4;
          sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                            (this_01,uVar8);
          psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                             (this_00,uVar8);
          *psVar5 = sVar4;
          sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                            (this_01,uVar8);
          psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,uVar8);
          *psVar5 = sVar4;
          uVar8 = uVar8 + 1;
        }
        *(size_t *)(this + 0x30) = (in->geometry_).size_;
        this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
        View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
        *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
        bVar2 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(in);
        if (bVar2) {
          memcpy(*(void **)this,in->data_,(in->geometry_).size_ << 2);
        }
        else {
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
          if (sVar4 == 1) {
            uVar1 = *(undefined8 *)this;
            piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                               ((View<int,false,std::allocator<unsigned_long>> *)in,0);
            marray_detail::
            OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(this,in,uVar1,piVar6);
          }
          else {
            sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
            if (sVar4 == 2) {
              uVar1 = *(undefined8 *)this;
              piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)in,0);
              marray_detail::
              OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(this,in,uVar1,piVar6);
            }
            else {
              sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
              if (sVar4 == 3) {
                uVar1 = *(undefined8 *)this;
                piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                   ((View<int,false,std::allocator<unsigned_long>> *)in,0);
                marray_detail::
                OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,in,uVar1,piVar6);
              }
              else {
                sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                if (sVar4 == 4) {
                  uVar1 = *(undefined8 *)this;
                  piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)in,0);
                  marray_detail::
                  OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(this,in,uVar1,piVar6);
                }
                else {
                  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                  if (sVar4 == 5) {
                    uVar1 = *(undefined8 *)this;
                    piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                       ((View<int,false,std::allocator<unsigned_long>> *)in,0);
                    marray_detail::
                    OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(this,in,uVar1,piVar6);
                  }
                  else {
                    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                    if (sVar4 == 6) {
                      uVar1 = *(undefined8 *)this;
                      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)in,0);
                      marray_detail::
                      OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(this,in,uVar1,piVar6);
                    }
                    else {
                      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                      if (sVar4 == 7) {
                        uVar1 = *(undefined8 *)this;
                        piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                           ((View<int,false,std::allocator<unsigned_long>> *)in,0);
                        marray_detail::
                        OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(this,in,uVar1,piVar6);
                      }
                      else {
                        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                        if (sVar4 == 8) {
                          uVar1 = *(undefined8 *)this;
                          piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                             ((View<int,false,std::allocator<unsigned_long>> *)in,0)
                          ;
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,in,uVar1,piVar6);
                        }
                        else {
                          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                          if (sVar4 == 9) {
                            uVar1 = *(undefined8 *)this;
                            piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                               ((View<int,false,std::allocator<unsigned_long>> *)in,
                                                0);
                            marray_detail::
                            OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                            ::operate(this,in,uVar1,piVar6);
                          }
                          else {
                            sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                            if (sVar4 == 10) {
                              uVar1 = *(undefined8 *)this;
                              piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                                                 ((View<int,false,std::allocator<unsigned_long>> *)
                                                  in,0);
                              marray_detail::
                              OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                              ::operate(this,in,uVar1,piVar6);
                            }
                            else {
                              View<int,_false,_std::allocator<unsigned_long>_>::begin
                                        ((const_iterator *)auStack_78,in);
                              for (uVar8 = 0; uVar8 < *(ulong *)(this + 0x30); uVar8 = uVar8 + 1) {
                                piVar7 = Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                         operator*((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)auStack_78);
                                *(int *)(*(long *)this + uVar8 * 4) = *piVar7;
                                Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                          ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                           auStack_78);
                              }
                              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                              ~_Vector_base((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             *)(auStack_78 + 0x18));
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return (Marray<int,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const View<TLocal, isConstLocal, ALocal>& in
)
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if( (void*)(this) != (void*)(&in) ) { // no self-assignment
        if(in.data_ == 0) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
            this->geometry_ = in.geometry_;
        }
        else if(this->overlaps(in)) {
            Marray<T, A> m = in; // temporary copy
            (*this) = m;
        }
        else {
            // re-alloc memory if necessary
            if(this->size() != in.size()) {
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }

            // copy geometry
            this->geometry_.resize(in.dimension());
            for(std::size_t j=0; j<in.dimension(); ++j) {
                this->geometry_.shape(j) = in.geometry_.shape(j);
                this->geometry_.shapeStrides(j) = in.geometry_.shapeStrides(j);
                this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
            }
            this->geometry_.size() = in.size();
            this->geometry_.isSimple() = true;
            this->geometry_.coordinateOrder() = in.coordinateOrder();

            // copy data
            if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
                memcpy(this->data_, in.data_, (in.size())*sizeof(T));
            }
            else if(in.dimension() == 1)
                marray_detail::OperateHelperBinary<1, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 2)
                marray_detail::OperateHelperBinary<2, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 3)
                marray_detail::OperateHelperBinary<3, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 4)
                marray_detail::OperateHelperBinary<4, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 5)
                marray_detail::OperateHelperBinary<5, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 6)
                marray_detail::OperateHelperBinary<6, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 7)
                marray_detail::OperateHelperBinary<7, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 8)
                marray_detail::OperateHelperBinary<8, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 9)
                marray_detail::OperateHelperBinary<9, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 10)
                marray_detail::OperateHelperBinary<10, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else {
                typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
                for(std::size_t j=0; j<this->size(); ++j, ++it) {
                    this->data_[j] = static_cast<T>(*it);
                }
            }
        }
    }
    testInvariant();
    return *this;
}